

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O1

void __thiscall
amrex::StateDescriptor::resetComponentBCs(StateDescriptor *this,int comp,BCRec *bcr,BndryFunc *func)

{
  pointer puVar1;
  tuple<amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  tVar2;
  pointer pBVar3;
  undefined8 uVar4;
  __uniq_ptr_data<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>,_true,_true>
  _Var5;
  undefined4 extraout_var;
  
  puVar1 = (this->bc_func).
           super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var5.
  super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl._0_4_ =
       (**func->_vptr_BndryFunc)(func);
  _Var5.
  super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl._4_4_ =
       extraout_var;
  tVar2.
  super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
         *)&puVar1[comp]._M_t.
            super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  ;
  puVar1[comp]._M_t.
  super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
       = _Var5.
         super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
         ._M_t.
         super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
         .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl;
  if (tVar2.
      super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
      .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl !=
      (_Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>)0x0) {
    (**(code **)(*(long *)tVar2.
                          super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
                          .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>.
                          _M_head_impl + 0x10))();
  }
  pBVar3 = (this->bc).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined8 *)(pBVar3[comp].bc + 4) = *(undefined8 *)(bcr->bc + 4);
  uVar4 = *(undefined8 *)(bcr->bc + 2);
  pBVar3 = pBVar3 + comp;
  *(undefined8 *)pBVar3->bc = *(undefined8 *)bcr->bc;
  *(undefined8 *)(pBVar3->bc + 2) = uVar4;
  return;
}

Assistant:

void
StateDescriptor::resetComponentBCs (int              comp,
                                    const BCRec&     bcr,
                                    const BndryFunc& func)
{
    BL_ASSERT(comp >= 0 && comp < ncomp);

    bc_func[comp].reset(func.clone());
    bc[comp] = bcr;
}